

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseCharRef(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  xmlParserErrors code;
  uint uVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  byte bVar5;
  char *msg;
  int iVar6;
  uint val;
  
  pxVar3 = ctxt->input;
  pxVar1 = pxVar3->cur;
  if (*pxVar1 == '&') {
    if (pxVar1[1] != '#') {
      pxVar3->cur = pxVar1 + 1;
      pxVar3->col = pxVar3->col + 1;
      if (pxVar1[1] == '\0') {
        xmlParserGrow(ctxt);
      }
      goto LAB_0012fb8f;
    }
    if (pxVar1[2] == 'x') {
      pxVar3->cur = pxVar1 + 3;
      pxVar3->col = pxVar3->col + 3;
      if (pxVar1[3] == '\0') {
        xmlParserGrow(ctxt);
        pxVar3 = ctxt->input;
      }
      if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      val = 0;
      iVar6 = 0;
      while( true ) {
        pxVar3 = ctxt->input;
        pbVar4 = pxVar3->cur;
        bVar5 = *pbVar4;
        if (bVar5 == 0x3b) break;
        if (1 < ctxt->disableSAX) goto LAB_0012fcb6;
        if (iVar6 < 0x15) {
          iVar6 = iVar6 + 1;
        }
        else {
          iVar6 = 0;
          if (((pxVar3->flags & 0x40) == 0) && (iVar6 = 0, (long)pxVar3->end - (long)pbVar4 < 0xfa))
          {
            xmlParserGrow(ctxt);
            bVar5 = *ctxt->input->cur;
          }
        }
        uVar2 = (uint)bVar5;
        if (9 < (byte)(bVar5 - 0x30)) {
          if (bVar5 < 0x61) {
            if (((bVar5 < 0x41) || (0x46 < bVar5)) || (0x13 < iVar6)) goto LAB_0012fc85;
            val = (val * 0x10 + uVar2) - 0x37;
            goto LAB_0012fb59;
          }
          if ((bVar5 < 0x67) && (iVar6 < 0x14)) {
            val = (val * 0x10 + uVar2) - 0x57;
            goto LAB_0012fb59;
          }
LAB_0012fc85:
          code = XML_ERR_INVALID_HEX_CHARREF;
LAB_0012fc8a:
          val = 0;
          xmlFatalErr(ctxt,code,(char *)0x0);
          pxVar3 = ctxt->input;
          pbVar4 = pxVar3->cur;
          uVar2 = 0;
          if (*pbVar4 == 0x3b) break;
          goto LAB_0012fb9f;
        }
        val = (val * 0x10 + uVar2) - 0x30;
LAB_0012fb59:
        if (0x10ffff < (int)val) {
          val = 0x110000;
        }
        xmlNextChar(ctxt);
        iVar6 = iVar6 + 1;
      }
    }
    else {
      pxVar3->cur = pxVar1 + 2;
      pxVar3->col = pxVar3->col + 2;
      if (pxVar1[2] == '\0') {
        xmlParserGrow(ctxt);
        pxVar3 = ctxt->input;
      }
      if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      val = 0;
      iVar6 = 0;
      while( true ) {
        pxVar3 = ctxt->input;
        pbVar4 = pxVar3->cur;
        bVar5 = *pbVar4;
        if (bVar5 == 0x3b) break;
        if (iVar6 < 0x15) {
          iVar6 = iVar6 + 1;
        }
        else {
          iVar6 = 0;
          if (((pxVar3->flags & 0x40) == 0) && (iVar6 = 0, (long)pxVar3->end - (long)pbVar4 < 0xfa))
          {
            xmlParserGrow(ctxt);
            bVar5 = *ctxt->input->cur;
          }
        }
        if (9 < (byte)(bVar5 - 0x30)) {
          code = XML_ERR_INVALID_DEC_CHARREF;
          goto LAB_0012fc8a;
        }
        val = (val * 10 + (uint)bVar5) - 0x30;
        if (0x10ffff < (int)val) {
          val = 0x110000;
        }
        xmlNextChar(ctxt);
        iVar6 = iVar6 + 1;
      }
    }
    pxVar3->col = pxVar3->col + 1;
    pxVar3->cur = pbVar4 + 1;
LAB_0012fcb6:
    if (0x10ffff < (int)val) {
      msg = "xmlParseCharRef: character reference out of bounds\n";
      goto LAB_0012fba6;
    }
    uVar2 = val;
    if ((int)val < 0x100) {
      if (0x1f < (int)val) {
        return val;
      }
      if ((val < 0xe) && ((0x2600U >> (val & 0x1f) & 1) != 0)) {
        return val;
      }
    }
    else if (val - 0x10000 < 0xffffd800 || val - 0xe000 < 0x1ffe) {
      return val;
    }
  }
  else {
LAB_0012fb8f:
    xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
    uVar2 = 0;
  }
LAB_0012fb9f:
  val = uVar2;
  msg = "xmlParseCharRef: invalid xmlChar value %d\n";
LAB_0012fba6:
  xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,msg,val);
  return 0;
}

Assistant:

int
xmlParseCharRef(xmlParserCtxtPtr ctxt) {
    int val = 0;
    int count = 0;

    /*
     * Using RAW/CUR/NEXT is okay since we are working on ASCII range here
     */
    if ((RAW == '&') && (NXT(1) == '#') &&
        (NXT(2) == 'x')) {
	SKIP(3);
	GROW;
	while ((RAW != ';') && (PARSER_STOPPED(ctxt) == 0)) {
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 16 + (CUR - '0');
	    else if ((RAW >= 'a') && (RAW <= 'f') && (count < 20))
	        val = val * 16 + (CUR - 'a') + 10;
	    else if ((RAW >= 'A') && (RAW <= 'F') && (count < 20))
	        val = val * 16 + (CUR - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else if  ((RAW == '&') && (NXT(1) == '#')) {
	SKIP(2);
	GROW;
	while (RAW != ';') { /* loop blocked by count */
	    if (count++ > 20) {
		count = 0;
		GROW;
	    }
	    if ((RAW >= '0') && (RAW <= '9'))
	        val = val * 10 + (CUR - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    NEXT;
	    count++;
	}
	if (RAW == ';') {
	    /* on purpose to avoid reentrancy problems with NEXT and SKIP */
	    ctxt->input->col++;
	    ctxt->input->cur++;
	}
    } else {
        if (RAW == '&')
            SKIP(1);
        xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
    }

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseCharRef: character reference out of bounds\n",
	        val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseCharRef: invalid xmlChar value %d\n",
	                  val);
    }
    return(0);
}